

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O1

cgltf_size
cgltf_calc_index_bound
          (cgltf_buffer_view *buffer_view,cgltf_size offset,cgltf_component_type component_type,
          cgltf_size count)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  cgltf_size cVar4;
  ulong uVar5;
  
  pvVar1 = buffer_view->buffer->data;
  lVar2 = buffer_view->offset + offset;
  if (component_type == cgltf_component_type_r_8u) {
    if (count == 0) {
      return 0;
    }
    uVar3 = 0;
    cVar4 = 0;
    do {
      uVar5 = (ulong)*(byte *)((long)pvVar1 + cVar4 + lVar2);
      if (uVar3 <= uVar5) {
        uVar3 = uVar5;
      }
      cVar4 = cVar4 + 1;
    } while (count != cVar4);
  }
  else if (component_type == cgltf_component_type_r_16u) {
    if (count == 0) {
      return 0;
    }
    uVar3 = 0;
    cVar4 = 0;
    do {
      uVar5 = (ulong)*(ushort *)((long)pvVar1 + cVar4 * 2 + lVar2);
      if (uVar3 <= uVar5) {
        uVar3 = uVar5;
      }
      cVar4 = cVar4 + 1;
    } while (count != cVar4);
  }
  else {
    if ((component_type != cgltf_component_type_r_32u) || (count == 0)) {
      return 0;
    }
    uVar3 = 0;
    cVar4 = 0;
    do {
      uVar5 = (ulong)*(uint *)((long)pvVar1 + cVar4 * 4 + lVar2);
      if (uVar3 <= uVar5) {
        uVar3 = uVar5;
      }
      cVar4 = cVar4 + 1;
    } while (count != cVar4);
  }
  return uVar3;
}

Assistant:

static cgltf_size cgltf_calc_index_bound(cgltf_buffer_view* buffer_view, cgltf_size offset, cgltf_component_type component_type, cgltf_size count)
{
    char* data = (char*)buffer_view->buffer->data + offset + buffer_view->offset;
    cgltf_size bound = 0;

    switch (component_type)
    {
    case cgltf_component_type_r_8u:
        for (size_t i = 0; i < count; ++i)
        {
            cgltf_size v = ((unsigned char*)data)[i];
            bound = bound > v ? bound : v;
        }
        break;

    case cgltf_component_type_r_16u:
        for (size_t i = 0; i < count; ++i)
        {
            cgltf_size v = ((unsigned short*)data)[i];
            bound = bound > v ? bound : v;
        }
        break;

    case cgltf_component_type_r_32u:
        for (size_t i = 0; i < count; ++i)
        {
            cgltf_size v = ((unsigned int*)data)[i];
            bound = bound > v ? bound : v;
        }
        break;

    default:
        ;
    }

    return bound;
}